

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QtPrivate::QColorPicker::paintEvent(QColorPicker *this,QPaintEvent *param_1)

{
  int iVar1;
  int iVar2;
  Representation RVar3;
  Representation RVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  QPainter p;
  undefined1 local_60 [24];
  undefined1 local_48 [12];
  int iStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)local_60,&(this->super_QFrame).super_QWidget.super_QPaintDevice);
  QFrame::drawFrame(&this->super_QFrame,(QPainter *)local_60);
  QVar5 = QWidget::contentsRect((QWidget *)this);
  RVar3 = QVar5.x1.m_i;
  local_48._0_8_ = (undefined8)RVar3.m_i;
  RVar4 = QVar5.y1.m_i;
  register0x00001200 = (double)RVar4.m_i;
  QPainter::drawPixmap((QPointF *)local_60,(QPixmap *)local_48);
  if (this->crossVisible == true) {
    QVar5 = QWidget::contentsRect((QWidget *)this);
    iVar1 = ((QVar5.x2.m_i.m_i - QVar5.x1.m_i) * (0x168 - this->hue)) / 0x168;
    iVar2 = ((QVar5.y2.m_i.m_i - QVar5.y1.m_i) * (0xff - this->sat)) / 0xff;
    QColor::QColor((QColor *)local_48,black);
    QPainter::setPen((QColor *)local_60);
    local_48._4_4_ = iVar2 + RVar4.m_i;
    local_48._0_4_ = (RVar3.m_i + iVar1) - 9;
    iStack_3c = RVar4.m_i + 1 + iVar2;
    local_48._8_4_ = RVar3.m_i + 10 + iVar1;
    QColor::QColor((QColor *)(local_60 + 8),black);
    QPainter::fillRect((QRect *)local_60,(QColor *)local_48);
    local_48._4_4_ = iVar2 + RVar4.m_i + -9;
    local_48._0_4_ = RVar3.m_i + iVar1;
    stack0xffffffffffffffc0 = (double)CONCAT44(RVar4.m_i + 10 + iVar2,RVar3.m_i + 1 + iVar1);
    QColor::QColor((QColor *)(local_60 + 8),black);
    QPainter::fillRect((QRect *)local_60,(QColor *)local_48);
  }
  QPainter::~QPainter((QPainter *)local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorPicker::paintEvent(QPaintEvent* )
{
    QPainter p(this);
    drawFrame(&p);
    QRect r = contentsRect();

    p.drawPixmap(r.topLeft(), pix);

    if (crossVisible) {
        QPoint pt = colPt() + r.topLeft();
        p.setPen(Qt::black);
        p.fillRect(pt.x()-9, pt.y(), 20, 2, Qt::black);
        p.fillRect(pt.x(), pt.y()-9, 2, 20, Qt::black);
    }
}